

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::fetchMoreTokens(Scanner *this)

{
  bool bVar1;
  size_type sVar2;
  byte local_92;
  byte local_91;
  Twine local_78;
  StringRef local_60;
  undefined1 local_50 [8];
  StringRef FirstChar;
  Scanner *this_local;
  
  FirstChar.Length = (size_t)this;
  if ((this->IsStartOfStream & 1U) != 0) {
    bVar1 = scanStreamStart(this);
    return bVar1;
  }
  scanToNextToken(this);
  if (this->Current == this->End) {
    bVar1 = scanStreamEnd(this);
    return bVar1;
  }
  removeStaleSimpleKeyCandidates(this);
  unrollIndent(this,this->Column);
  if ((this->Column == 0) && (*this->Current == '%')) {
    bVar1 = scanDirective(this);
    return bVar1;
  }
  if ((((this->Column == 0) && (this->Current + 4 <= this->End)) && (*this->Current == '-')) &&
     (((this->Current[1] == '-' && (this->Current[2] == '-')) &&
      ((this->Current + 3 == this->End || (bVar1 = isBlankOrBreak(this,this->Current + 3), bVar1))))
     )) {
    bVar1 = scanDocumentIndicator(this,true);
    return bVar1;
  }
  if ((((this->Column == 0) && (this->Current + 4 <= this->End)) &&
      ((*this->Current == '.' && ((this->Current[1] == '.' && (this->Current[2] == '.')))))) &&
     ((this->Current + 3 == this->End || (bVar1 = isBlankOrBreak(this,this->Current + 3), bVar1))))
  {
    bVar1 = scanDocumentIndicator(this,false);
    return bVar1;
  }
  if (*this->Current == '[') {
    bVar1 = scanFlowCollectionStart(this,true);
    return bVar1;
  }
  if (*this->Current == '{') {
    bVar1 = scanFlowCollectionStart(this,false);
    return bVar1;
  }
  if (*this->Current == ']') {
    bVar1 = scanFlowCollectionEnd(this,true);
    return bVar1;
  }
  if (*this->Current == '}') {
    bVar1 = scanFlowCollectionEnd(this,false);
    return bVar1;
  }
  if (*this->Current == ',') {
    bVar1 = scanFlowEntry(this);
    return bVar1;
  }
  if ((*this->Current == '-') && (bVar1 = isBlankOrBreak(this,this->Current + 1), bVar1)) {
    bVar1 = scanBlockEntry(this);
    return bVar1;
  }
  if ((*this->Current == '?') &&
     ((this->FlowLevel != 0 || (bVar1 = isBlankOrBreak(this,this->Current + 1), bVar1)))) {
    bVar1 = scanKey(this);
    return bVar1;
  }
  if ((*this->Current == ':') &&
     ((this->FlowLevel != 0 || (bVar1 = isBlankOrBreak(this,this->Current + 1), bVar1)))) {
    bVar1 = scanValue(this);
    return bVar1;
  }
  if (*this->Current == '*') {
    bVar1 = scanAliasOrAnchor(this,true);
    return bVar1;
  }
  if (*this->Current == '&') {
    bVar1 = scanAliasOrAnchor(this,false);
    return bVar1;
  }
  if (*this->Current == '!') {
    bVar1 = scanTag(this);
    return bVar1;
  }
  if ((*this->Current == '|') && (this->FlowLevel == 0)) {
    bVar1 = scanBlockScalar(this,true);
    return bVar1;
  }
  if ((*this->Current == '>') && (this->FlowLevel == 0)) {
    bVar1 = scanBlockScalar(this,false);
    return bVar1;
  }
  if (*this->Current == '\'') {
    bVar1 = scanFlowScalar(this,false);
    return bVar1;
  }
  if (*this->Current == '\"') {
    bVar1 = scanFlowScalar(this,true);
    return bVar1;
  }
  local_50 = (undefined1  [8])this->Current;
  FirstChar.Data = (char *)0x1;
  bVar1 = isBlankOrBreak(this,this->Current);
  if (!bVar1) {
    strlen("-?:,[]{}#&*!|>\'\"%@`");
    sVar2 = StringRef::find_first_of((StringRef *)local_50,local_60,0);
    local_91 = 1;
    if (sVar2 == 0xffffffffffffffff) goto LAB_00267e13;
  }
  if (*this->Current == '-') {
    bVar1 = isBlankOrBreak(this,this->Current + 1);
    local_91 = 1;
    if (!bVar1) goto LAB_00267e13;
  }
  if ((this->FlowLevel == 0) && ((*this->Current == '?' || (*this->Current == ':')))) {
    bVar1 = isBlankOrBreak(this,this->Current + 1);
    local_91 = 1;
    if (bVar1) goto LAB_00267e13;
  }
  local_92 = 0;
  if ((((this->FlowLevel == 0) && (local_92 = 0, *this->Current == ':')) &&
      (local_92 = 0, this->Current + 2 < this->End)) && (local_92 = 0, this->Current[1] == ':')) {
    bVar1 = isBlankOrBreak(this,this->Current + 2);
    local_92 = bVar1 ^ 0xff;
  }
  local_91 = local_92;
LAB_00267e13:
  if ((local_91 & 1) == 0) {
    Twine::Twine(&local_78,"Unrecognized character while tokenizing.");
    setError(this,&local_78);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = scanPlainScalar(this);
  }
  return this_local._7_1_;
}

Assistant:

bool Scanner::fetchMoreTokens() {
  if (IsStartOfStream)
    return scanStreamStart();

  scanToNextToken();

  if (Current == End)
    return scanStreamEnd();

  removeStaleSimpleKeyCandidates();

  unrollIndent(Column);

  if (Column == 0 && *Current == '%')
    return scanDirective();

  if (Column == 0 && Current + 4 <= End
      && *Current == '-'
      && *(Current + 1) == '-'
      && *(Current + 2) == '-'
      && (Current + 3 == End || isBlankOrBreak(Current + 3)))
    return scanDocumentIndicator(true);

  if (Column == 0 && Current + 4 <= End
      && *Current == '.'
      && *(Current + 1) == '.'
      && *(Current + 2) == '.'
      && (Current + 3 == End || isBlankOrBreak(Current + 3)))
    return scanDocumentIndicator(false);

  if (*Current == '[')
    return scanFlowCollectionStart(true);

  if (*Current == '{')
    return scanFlowCollectionStart(false);

  if (*Current == ']')
    return scanFlowCollectionEnd(true);

  if (*Current == '}')
    return scanFlowCollectionEnd(false);

  if (*Current == ',')
    return scanFlowEntry();

  if (*Current == '-' && isBlankOrBreak(Current + 1))
    return scanBlockEntry();

  if (*Current == '?' && (FlowLevel || isBlankOrBreak(Current + 1)))
    return scanKey();

  if (*Current == ':' && (FlowLevel || isBlankOrBreak(Current + 1)))
    return scanValue();

  if (*Current == '*')
    return scanAliasOrAnchor(true);

  if (*Current == '&')
    return scanAliasOrAnchor(false);

  if (*Current == '!')
    return scanTag();

  if (*Current == '|' && !FlowLevel)
    return scanBlockScalar(true);

  if (*Current == '>' && !FlowLevel)
    return scanBlockScalar(false);

  if (*Current == '\'')
    return scanFlowScalar(false);

  if (*Current == '"')
    return scanFlowScalar(true);

  // Get a plain scalar.
  StringRef FirstChar(Current, 1);
  if (!(isBlankOrBreak(Current)
        || FirstChar.find_first_of("-?:,[]{}#&*!|>'\"%@`") != StringRef::npos)
      || (*Current == '-' && !isBlankOrBreak(Current + 1))
      || (!FlowLevel && (*Current == '?' || *Current == ':')
          && isBlankOrBreak(Current + 1))
      || (!FlowLevel && *Current == ':'
                      && Current + 2 < End
                      && *(Current + 1) == ':'
                      && !isBlankOrBreak(Current + 2)))
    return scanPlainScalar();

  setError("Unrecognized character while tokenizing.");
  return false;
}